

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::moveAppend
          (QGenericArrayOps<QSocks5RevivedDatagram> *this,QSocks5RevivedDatagram *b,
          QSocks5RevivedDatagram *e)

{
  QSocks5RevivedDatagram *pQVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  QHostAddressPrivate *pQVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
    qVar6 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
    do {
      pDVar2 = (b->data).d.d;
      (b->data).d.d = (Data *)0x0;
      pQVar1[qVar6].data.d.d = pDVar2;
      pcVar3 = (b->data).d.ptr;
      (b->data).d.ptr = (char *)0x0;
      pQVar1[qVar6].data.d.ptr = pcVar3;
      qVar4 = (b->data).d.size;
      (b->data).d.size = 0;
      pQVar1[qVar6].data.d.size = qVar4;
      pQVar5 = (b->address).d.d.ptr;
      (b->address).d.d.ptr = (QHostAddressPrivate *)0x0;
      pQVar1[qVar6].address.d.d.ptr = pQVar5;
      pQVar1[qVar6].port = b->port;
      b = b + 1;
      qVar6 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size + 1;
      (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size = qVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }